

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

Abc_Obj_t * Abc_AigMiter2(Abc_Aig_t *pMan,Vec_Ptr_t *vPairs)

{
  Abc_Obj_t *pAVar1;
  int local_2c;
  int i;
  Abc_Obj_t *pXor;
  Abc_Obj_t *pMiter;
  Vec_Ptr_t *vPairs_local;
  Abc_Aig_t *pMan_local;
  
  if (vPairs->nSize % 2 == 0) {
    pAVar1 = Abc_AigConst1(pMan->pNtkAig);
    pXor = Abc_ObjNot(pAVar1);
    for (local_2c = 0; local_2c < vPairs->nSize; local_2c = local_2c + 2) {
      pAVar1 = Abc_AigXor(pMan,(Abc_Obj_t *)vPairs->pArray[local_2c],
                          (Abc_Obj_t *)vPairs->pArray[local_2c + 1]);
      pXor = Abc_AigOr(pMan,pXor,pAVar1);
    }
    return pXor;
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                ,0x339,"Abc_Obj_t *Abc_AigMiter2(Abc_Aig_t *, Vec_Ptr_t *)");
}

Assistant:

Abc_Obj_t * Abc_AigMiter2( Abc_Aig_t * pMan, Vec_Ptr_t * vPairs )
{
    Abc_Obj_t * pMiter, * pXor;
    int i;
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    pMiter = Abc_ObjNot( Abc_AigConst1(pMan->pNtkAig) );
    for ( i = 0; i < vPairs->nSize; i += 2 )
    {
        pXor   = Abc_AigXor( pMan, (Abc_Obj_t *)vPairs->pArray[i], (Abc_Obj_t *)vPairs->pArray[i+1] );
        pMiter = Abc_AigOr( pMan, pMiter, pXor );
    }
    return pMiter;
}